

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::PixelBufferAccess::PixelBufferAccess
          (PixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,int rowPitch
          ,int slicePitch,void *data)

{
  int rowPitch_local;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  PixelBufferAccess *this_local;
  
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&this->super_ConstPixelBufferAccess,format,width,height,depth,rowPitch,slicePitch,data)
  ;
  return;
}

Assistant:

PixelBufferAccess::PixelBufferAccess (const TextureFormat& format, int width, int height, int depth, int rowPitch, int slicePitch, void* data)
	: ConstPixelBufferAccess(format, width, height, depth, rowPitch, slicePitch, data)
{
}